

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall
cmTarget::cmTarget(cmTarget *this,string *name,TargetType type,Visibility vis,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr p_Var2;
  cmMakefile *pcVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _Alloc_hider _Var4;
  size_type sVar5;
  undefined8 uVar6;
  pointer pbVar7;
  int iVar8;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var9;
  string *psVar10;
  char *pcVar11;
  char *pcVar12;
  cmGlobalGenerator *pcVar13;
  size_t sVar14;
  long *plVar15;
  undefined8 value;
  pointer pbVar16;
  cmTarget *this_01;
  long lVar17;
  cmStringRange cVar18;
  cmBacktraceRange cVar19;
  string configUpper;
  string defKey;
  string property;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  string propValue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  string local_138;
  cmMakefile *local_110;
  cmTarget *local_108;
  string local_100;
  string local_e0;
  string *local_c0;
  undefined1 local_b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  long local_88 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string *local_58;
  string local_50;
  
  local_110 = (cmMakefile *)CONCAT44(local_110._4_4_,type);
  local_c0 = name;
  _Var9._M_head_impl = (cmTargetInternals *)operator_new(0x340);
  memset(_Var9._M_head_impl,0,0x340);
  ((_Var9._M_head_impl)->Name)._M_dataplus = (_Alloc_hider)&((_Var9._M_head_impl)->Name).field_2;
  ((_Var9._M_head_impl)->Name)._M_string_length = 0;
  ((_Var9._M_head_impl)->Name).field_2._M_local_buf[0] = '\0';
  ((_Var9._M_head_impl)->InstallPath)._M_dataplus =
       (_Alloc_hider)&((_Var9._M_head_impl)->InstallPath).field_2;
  ((_Var9._M_head_impl)->InstallPath)._M_string_length = 0;
  ((_Var9._M_head_impl)->InstallPath).field_2._M_local_buf[0] = '\0';
  ((_Var9._M_head_impl)->RuntimeInstallPath)._M_dataplus =
       (_Alloc_hider)&((_Var9._M_head_impl)->RuntimeInstallPath).field_2;
  ((_Var9._M_head_impl)->RuntimeInstallPath)._M_string_length = 0;
  ((_Var9._M_head_impl)->RuntimeInstallPath).field_2._M_local_buf[0] = '\0';
  *(__node_base_ptr **)&((_Var9._M_head_impl)->Properties).Map_ =
       &((_Var9._M_head_impl)->Properties).Map_._M_h._M_single_bucket;
  ((_Var9._M_head_impl)->Properties).Map_._M_h._M_bucket_count = 1;
  ((_Var9._M_head_impl)->Properties).Map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ((_Var9._M_head_impl)->Properties).Map_._M_h._M_element_count = 0;
  ((_Var9._M_head_impl)->Properties).Map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ((_Var9._M_head_impl)->Properties).Map_._M_h._M_rehash_policy._M_next_resize = 0;
  ((_Var9._M_head_impl)->Properties).Map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var2 = &((_Var9._M_head_impl)->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header;
  ((_Var9._M_head_impl)->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ((_Var9._M_head_impl)->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  ((_Var9._M_head_impl)->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var2;
  ((_Var9._M_head_impl)->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var2;
  p_Var2 = &((_Var9._M_head_impl)->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header.
            _M_header;
  ((_Var9._M_head_impl)->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  ((_Var9._M_head_impl)->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  ((_Var9._M_head_impl)->PostBuildCommands).
  super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((_Var9._M_head_impl)->PostBuildCommands).
  super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((_Var9._M_head_impl)->PreLinkCommands).
  super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   &((_Var9._M_head_impl)->PostBuildCommands).
    super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_> = 0;
  *(undefined8 *)
   &((_Var9._M_head_impl)->PreLinkCommands).
    super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_> = 0;
  ((_Var9._M_head_impl)->PreLinkCommands).
  super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((_Var9._M_head_impl)->PreBuildCommands).
  super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((_Var9._M_head_impl)->PreBuildCommands).
  super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((_Var9._M_head_impl)->Utilities)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)
   &((_Var9._M_head_impl)->PreBuildCommands).
    super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_> = 0;
  ((_Var9._M_head_impl)->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = p_Var2;
  ((_Var9._M_head_impl)->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = p_Var2;
  memset(&((_Var9._M_head_impl)->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header.
          _M_node_count,0,0x1c8);
  (this->impl)._M_t.
  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
  super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl = _Var9._M_head_impl;
  local_108 = this;
  if (mf != (cmMakefile *)0x0) {
    (_Var9._M_head_impl)->TargetType = local_110._0_4_;
    (_Var9._M_head_impl)->Makefile = mf;
    local_110 = mf;
    std::__cxx11::string::_M_assign((string *)&(_Var9._M_head_impl)->Name);
    this_01 = local_108;
    _Var9._M_head_impl =
         (local_108->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    (_Var9._M_head_impl)->IsImportedTarget = vis - VisibilityImported < 2;
    (_Var9._M_head_impl)->IsGeneratorProvided = false;
    (_Var9._M_head_impl)->HaveInstallRule = false;
    (_Var9._M_head_impl)->DLLPlatform = false;
    (_Var9._M_head_impl)->IsAndroid = false;
    (_Var9._M_head_impl)->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
    (_Var9._M_head_impl)->BuildInterfaceIncludesAppended = false;
    pcVar3 = (_Var9._M_head_impl)->Makefile;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"CMAKE_IMPORT_LIBRARY_SUFFIX","");
    psVar10 = cmMakefile::GetSafeDefinition(pcVar3,&local_100);
    ((this_01->impl)._M_t.
     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
     super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->DLLPlatform =
         psVar10->_M_string_length != 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                               local_100.field_2._M_local_buf[0]) + 1);
    }
    pcVar3 = ((this_01->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"CMAKE_SYSTEM_NAME","");
    psVar10 = cmMakefile::GetSafeDefinition(pcVar3,&local_100);
    iVar8 = std::__cxx11::string::compare((char *)psVar10);
    ((this_01->impl)._M_t.
     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
     super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsAndroid = iVar8 == 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                               local_100.field_2._M_local_buf[0]) + 1);
    }
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    local_100._M_string_length = 0;
    local_100.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)&local_100);
    std::__cxx11::string::append((char *)&local_100);
    if ((((this_01->impl)._M_t.
          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
          super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType | 2) != 7) {
      paVar1 = &local_138.field_2;
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"ANDROID_API","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"ANDROID_API_MIN","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"ANDROID_ARCH","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"ANDROID_STL_TYPE","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"ANDROID_SKIP_ANT_STEP","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"ANDROID_PROCESS_MAX","")
      ;
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"ANDROID_PROGUARD","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"ANDROID_PROGUARD_CONFIG_PATH","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"ANDROID_SECURE_PROPS_PATH","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"ANDROID_NATIVE_LIB_DIRECTORIES","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"ANDROID_NATIVE_LIB_DEPENDENCIES","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"ANDROID_JAVA_SOURCE_DIR","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"ANDROID_JAR_DIRECTORIES","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"ANDROID_JAR_DEPENDENCIES","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"ANDROID_ASSETS_DIRECTORIES","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"ANDROID_ANT_ADDITIONAL_OPTIONS","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"BUILD_RPATH","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"BUILD_RPATH_USE_ORIGIN","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"INSTALL_NAME_DIR","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"INSTALL_RPATH","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar12 = cmMakefile::GetDefinition(local_110,&local_100);
      pcVar11 = "";
      if (pcVar12 != (char *)0x0) {
        pcVar11 = pcVar12;
      }
      SetProperty(local_108,&local_138,pcVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"INSTALL_RPATH_USE_LINK_PATH","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 == (char *)0x0) {
        pcVar11 = "OFF";
      }
      SetProperty(local_108,&local_138,pcVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"INTERPROCEDURAL_OPTIMIZATION","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"SKIP_BUILD_RPATH","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 == (char *)0x0) {
        pcVar11 = "OFF";
      }
      SetProperty(local_108,&local_138,pcVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"BUILD_WITH_INSTALL_RPATH","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar12 = cmMakefile::GetDefinition(local_110,&local_100);
      pcVar11 = "OFF";
      if (pcVar12 != (char *)0x0) {
        pcVar11 = pcVar12;
      }
      SetProperty(local_108,&local_138,pcVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"ARCHIVE_OUTPUT_DIRECTORY","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"LIBRARY_OUTPUT_DIRECTORY","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"RUNTIME_OUTPUT_DIRECTORY","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"PDB_OUTPUT_DIRECTORY","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"COMPILE_PDB_OUTPUT_DIRECTORY","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"FRAMEWORK","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Fortran_FORMAT","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"Fortran_MODULE_DIRECTORY","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"Fortran_COMPILER_LAUNCHER","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"GNUtoMS","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"OSX_ARCHITECTURES","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"IOS_INSTALL_COMBINED","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"AUTOMOC","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"AUTOUIC","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"AUTORCC","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"AUTOGEN_ORIGIN_DEPENDS","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"AUTOGEN_PARALLEL","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"AUTOMOC_COMPILER_PREDEFINES","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"AUTOMOC_DEPEND_FILTERS","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"AUTOMOC_MACRO_NAMES","")
      ;
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"AUTOMOC_MOC_OPTIONS","")
      ;
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"AUTOUIC_OPTIONS","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"AUTOUIC_SEARCH_PATHS","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"AUTORCC_OPTIONS","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"LINK_DEPENDS_NO_SHARED","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"LINK_INTERFACE_LIBRARIES","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"MSVC_RUNTIME_LIBRARY","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"WIN32_EXECUTABLE","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"MACOSX_BUNDLE","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"MACOSX_RPATH","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"NO_SYSTEM_FROM_IMPORTED","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"BUILD_WITH_INSTALL_NAME_DIR","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"C_CLANG_TIDY","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"C_COMPILER_LAUNCHER","")
      ;
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"C_CPPLINT","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"C_CPPCHECK","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"C_INCLUDE_WHAT_YOU_USE","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"LINK_WHAT_YOU_USE","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"C_STANDARD","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"C_STANDARD_REQUIRED","")
      ;
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"C_EXTENSIONS","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"CXX_CLANG_TIDY","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"CXX_COMPILER_LAUNCHER","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"CXX_CPPLINT","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"CXX_CPPCHECK","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"CXX_INCLUDE_WHAT_YOU_USE","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"CXX_STANDARD","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"CXX_STANDARD_REQUIRED","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"CXX_EXTENSIONS","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"CUDA_STANDARD","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"CUDA_STANDARD_REQUIRED","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"CUDA_EXTENSIONS","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"CUDA_COMPILER_LAUNCHER","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"CUDA_SEPARABLE_COMPILATION","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"LINK_SEARCH_START_STATIC","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"LINK_SEARCH_END_STATIC","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"FOLDER","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"Swift_MODULE_DIRECTORY","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"VS_JUST_MY_CODE_DEBUGGING","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      this_01 = local_108;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        this_01 = local_108;
      }
    }
    if (((this_01->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType != 5) {
      local_b8._0_8_ = (string *)0x0;
      local_b8._8_8_ = (string *)0x0;
      local_b8._16_8_ = (pointer)0x0;
      cmMakefile::GetConfigurations
                (&local_50,local_110,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b8,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      local_58 = (string *)local_b8._8_8_;
      if (local_b8._0_8_ != local_b8._8_8_) {
        psVar10 = (string *)local_b8._0_8_;
        do {
          local_c0 = psVar10;
          cmsys::SystemTools::UpperCase(&local_138,psVar10);
          lVar17 = 0;
          do {
            if ((((local_108->impl)._M_t.
                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType != 7)
               || (iVar8 = strcmp(*(char **)((long)&
                                                  cmTarget(std::__cxx11::string_const&,cmStateEnums::TargetType,cmTarget::Visibility,cmMakefile*)
                                                  ::configProps + lVar17),"MAP_IMPORTED_CONFIG_"),
                  iVar8 == 0)) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_e0,
                         *(char **)((long)&cmTarget(std::__cxx11::string_const&,cmStateEnums::TargetType,cmTarget::Visibility,cmMakefile*)
                                           ::configProps + lVar17),
                         (allocator<char> *)local_98._M_local_buf);
              std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_138._M_dataplus._M_p);
              std::__cxx11::string::replace
                        ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                         (ulong)local_e0._M_dataplus._M_p);
              pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
              if (pcVar11 != (char *)0x0) {
                SetProperty(local_108,&local_e0,pcVar11);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1
                               );
              }
            }
            this_01 = local_108;
            lVar17 = lVar17 + 8;
          } while (lVar17 != 0x38);
          iVar8 = ((local_108->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType;
          if ((iVar8 != 0) && (iVar8 != 7)) {
            cmsys::SystemTools::UpperCase(&local_e0,local_c0);
            std::__cxx11::string::append((char *)&local_e0);
            std::__cxx11::string::replace
                      ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                       (ulong)local_e0._M_dataplus._M_p);
            pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
            if (pcVar11 != (char *)0x0) {
              SetProperty(this_01,&local_e0,pcVar11);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          psVar10 = local_c0 + 1;
        } while (psVar10 != local_58);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_b8);
    }
    cmMakefile::GetBacktrace
              (((this_01->impl)._M_t.
                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
    sVar5 = local_138._M_string_length;
    _Var4._M_p = local_138._M_dataplus._M_p;
    _Var9._M_head_impl =
         (this_01->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    local_138._M_dataplus._M_p = (pointer)0x0;
    local_138._M_string_length = 0;
    this_00._M_pi =
         ((_Var9._M_head_impl)->Backtrace).TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    *(pointer *)&((_Var9._M_head_impl)->Backtrace).TopEntry = _Var4._M_p;
    ((_Var9._M_head_impl)->Backtrace).TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5;
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length);
    }
    _Var9._M_head_impl =
         (this_01->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    if ((_Var9._M_head_impl)->IsImportedTarget == false) {
      cVar18 = cmMakefile::GetIncludeDirectoriesEntries_abi_cxx11_((_Var9._M_head_impl)->Makefile);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &(_Var9._M_head_impl)->IncludeDirectoriesEntries,
                 ((_Var9._M_head_impl)->IncludeDirectoriesEntries).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,cVar18.Begin._M_current._M_current,
                 cVar18.End._M_current._M_current);
      _Var9._M_head_impl =
           (this_01->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      cVar19 = cmMakefile::GetIncludeDirectoriesBacktraces((_Var9._M_head_impl)->Makefile);
      std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>
                ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
                 &(_Var9._M_head_impl)->IncludeDirectoriesBacktraces,
                 ((_Var9._M_head_impl)->IncludeDirectoriesBacktraces).
                 super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                 _M_impl.super__Vector_impl_data._M_finish,cVar19.Begin._M_current._M_current,
                 cVar19.End._M_current._M_current);
      _Var9._M_head_impl =
           (this_01->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      pcVar3 = (_Var9._M_head_impl)->Makefile;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&(_Var9._M_head_impl)->SystemIncludeDirectories,
                 (pcVar3->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_left,&(pcVar3->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header.
                          _M_header);
      _Var9._M_head_impl =
           (this_01->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      cVar18 = cmMakefile::GetCompileOptionsEntries_abi_cxx11_((_Var9._M_head_impl)->Makefile);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &(_Var9._M_head_impl)->CompileOptionsEntries,
                 ((_Var9._M_head_impl)->CompileOptionsEntries).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,cVar18.Begin._M_current._M_current,
                 cVar18.End._M_current._M_current);
      _Var9._M_head_impl =
           (this_01->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      cVar19 = cmMakefile::GetCompileOptionsBacktraces((_Var9._M_head_impl)->Makefile);
      std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>
                ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
                 &(_Var9._M_head_impl)->CompileOptionsBacktraces,
                 ((_Var9._M_head_impl)->CompileOptionsBacktraces).
                 super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                 _M_impl.super__Vector_impl_data._M_finish,cVar19.Begin._M_current._M_current,
                 cVar19.End._M_current._M_current);
      _Var9._M_head_impl =
           (this_01->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      cVar18 = cmMakefile::GetLinkOptionsEntries_abi_cxx11_((_Var9._M_head_impl)->Makefile);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &(_Var9._M_head_impl)->LinkOptionsEntries,
                 ((_Var9._M_head_impl)->LinkOptionsEntries).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,cVar18.Begin._M_current._M_current,
                 cVar18.End._M_current._M_current);
      _Var9._M_head_impl =
           (this_01->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      cVar19 = cmMakefile::GetLinkOptionsBacktraces((_Var9._M_head_impl)->Makefile);
      std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>
                ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
                 &(_Var9._M_head_impl)->LinkOptionsBacktraces,
                 ((_Var9._M_head_impl)->LinkOptionsBacktraces).
                 super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                 _M_impl.super__Vector_impl_data._M_finish,cVar19.Begin._M_current._M_current,
                 cVar19.End._M_current._M_current);
      _Var9._M_head_impl =
           (this_01->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      cVar18 = cmMakefile::GetLinkDirectoriesEntries_abi_cxx11_((_Var9._M_head_impl)->Makefile);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &(_Var9._M_head_impl)->LinkDirectoriesEntries,
                 ((_Var9._M_head_impl)->LinkDirectoriesEntries).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,cVar18.Begin._M_current._M_current,
                 cVar18.End._M_current._M_current);
      _Var9._M_head_impl =
           (this_01->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      cVar19 = cmMakefile::GetLinkDirectoriesBacktraces((_Var9._M_head_impl)->Makefile);
      std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>
                ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
                 &(_Var9._M_head_impl)->LinkDirectoriesBacktraces,
                 ((_Var9._M_head_impl)->LinkDirectoriesBacktraces).
                 super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                 _M_impl.super__Vector_impl_data._M_finish,cVar19.Begin._M_current._M_current,
                 cVar19.End._M_current._M_current);
    }
    if ((((this_01->impl)._M_t.
          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
          super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType | 2) != 7) {
      paVar1 = &local_138.field_2;
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"C_VISIBILITY_PRESET","")
      ;
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"CXX_VISIBILITY_PRESET","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"CUDA_VISIBILITY_PRESET","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"VISIBILITY_INLINES_HIDDEN","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(local_108,&local_138,pcVar11);
      }
      this_01 = local_108;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        this_01 = local_108;
      }
    }
    if (((this_01->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType == 0) {
      paVar1 = &local_138.field_2;
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"ANDROID_GUI","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(this_01,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"CROSSCOMPILING_EMULATOR","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(this_01,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"ENABLE_EXPORTS","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(this_01,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
    }
    if ((((this_01->impl)._M_t.
          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
          super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType & 0xfffffffe)
        == 2) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"POSITION_INDEPENDENT_CODE","");
      SetProperty(this_01,&local_138,"True");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
    }
    if ((((this_01->impl)._M_t.
          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
          super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType & 0xfffffffd)
        == 0) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"WINDOWS_EXPORT_ALL_SYMBOLS","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(this_01,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
    }
    if ((((this_01->impl)._M_t.
          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
          super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType | 2) != 7) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"POSITION_INDEPENDENT_CODE","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(this_01,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
    }
    _Var9._M_head_impl =
         (this_01->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    cmMakefile::RecordPolicies((_Var9._M_head_impl)->Makefile,&(_Var9._M_head_impl)->PolicyMap);
    _Var9._M_head_impl =
         (this_01->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    if ((_Var9._M_head_impl)->TargetType == 7) {
      cmPolicies::PolicyMap::Set(&(_Var9._M_head_impl)->PolicyMap,CMP0022,NEW);
    }
    if ((((this_01->impl)._M_t.
          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
          super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType | 2) != 7) {
      paVar1 = &local_138.field_2;
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"JOB_POOL_COMPILE","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(this_01,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"JOB_POOL_LINK","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(this_01,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
    }
    if ((int)((this_01->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType < 6) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"DOTNET_TARGET_FRAMEWORK_VERSION","");
      std::__cxx11::string::replace
                ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                 (ulong)local_138._M_dataplus._M_p);
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_100);
      if (pcVar11 != (char *)0x0) {
        SetProperty(this_01,&local_138,pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
    }
    if ((((this_01->impl)._M_t.
          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
          super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType | 2) != 7) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"CMAKE_VS_GLOBALS","");
      pcVar11 = cmMakefile::GetDefinition(local_110,&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if (pcVar11 != (char *)0x0) {
        pcVar13 = cmMakefile::GetGlobalGenerator(local_110);
        (*pcVar13->_vptr_cmGlobalGenerator[3])(&local_138,pcVar13);
        iVar8 = strncmp(local_138._M_dataplus._M_p,"Visual Studio",0xd);
        if (iVar8 == 0) {
          local_78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          paVar1 = &local_e0.field_2;
          local_e0._M_dataplus._M_p = (pointer)paVar1;
          sVar14 = strlen(pcVar11);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,pcVar11,pcVar11 + sVar14);
          cmSystemTools::ExpandListArgument(&local_e0,&local_78,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar1) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          local_e0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"VS_GLOBAL_","");
          pbVar7 = local_78.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pbVar16 = local_78.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              lVar17 = std::__cxx11::string::find((char)pbVar16,0x3d);
              if (lVar17 != -1) {
                std::__cxx11::string::substr((ulong)&local_98,(ulong)pbVar16);
                plVar15 = (long *)std::__cxx11::string::replace
                                            ((ulong)&local_98,0,(char *)0x0,
                                             (ulong)local_e0._M_dataplus._M_p);
                psVar10 = (string *)(plVar15 + 2);
                if ((string *)*plVar15 == psVar10) {
                  local_b8._16_8_ = (psVar10->_M_dataplus)._M_p;
                  local_b8._24_8_ = plVar15[3];
                  local_b8._0_8_ = (string *)(local_b8 + 0x10);
                }
                else {
                  local_b8._16_8_ = (psVar10->_M_dataplus)._M_p;
                  local_b8._0_8_ = (string *)*plVar15;
                }
                local_b8._8_8_ = plVar15[1];
                *plVar15 = (long)psVar10;
                plVar15[1] = 0;
                *(undefined1 *)(plVar15 + 2) = 0;
                if ((long *)local_98._M_allocated_capacity != local_88) {
                  operator_delete((void *)local_98._M_allocated_capacity,local_88[0] + 1);
                }
                std::__cxx11::string::substr((ulong)&local_98,(ulong)pbVar16);
                uVar6 = local_98._M_allocated_capacity;
                std::__cxx11::string::replace
                          ((ulong)&local_100,6,(char *)(local_100._M_string_length - 6),
                           local_b8._0_8_);
                value = cmMakefile::GetDefinition(local_110,&local_100);
                if (((long *)value != (long *)0x0) || (value = uVar6, (long *)uVar6 != (long *)0x0))
                {
                  SetProperty(local_108,(string *)local_b8,(char *)value);
                }
                if ((long *)local_98._M_allocated_capacity != local_88) {
                  operator_delete((void *)local_98._M_allocated_capacity,local_88[0] + 1);
                }
                if ((string *)local_b8._0_8_ != (string *)(local_b8 + 0x10)) {
                  operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
                }
              }
              pbVar16 = pbVar16 + 1;
            } while (pbVar16 != pbVar7);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_78);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                               local_100.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  __assert_fail("mf",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmTarget.cxx"
                ,0xd5,
                "cmTarget::cmTarget(const std::string &, cmStateEnums::TargetType, Visibility, cmMakefile *)"
               );
}

Assistant:

cmTarget::cmTarget(std::string const& name, cmStateEnums::TargetType type,
                   Visibility vis, cmMakefile* mf)
  : impl(cm::make_unique<cmTargetInternals>())
{
  assert(mf);
  impl->TargetType = type;
  impl->Makefile = mf;
  impl->Name = name;
  impl->IsGeneratorProvided = false;
  impl->HaveInstallRule = false;
  impl->DLLPlatform = false;
  impl->IsAndroid = false;
  impl->IsImportedTarget =
    (vis == VisibilityImported || vis == VisibilityImportedGlobally);
  impl->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
  impl->BuildInterfaceIncludesAppended = false;

  // Check whether this is a DLL platform.
  impl->DLLPlatform =
    !impl->Makefile->GetSafeDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX").empty();

  // Check whether we are targeting an Android platform.
  impl->IsAndroid =
    (impl->Makefile->GetSafeDefinition("CMAKE_SYSTEM_NAME") == "Android");

  std::string defKey;
  defKey.reserve(128);
  defKey += "CMAKE_";
  auto initProp = [this, mf, &defKey](const std::string& property) {
    // Replace everything after "CMAKE_"
    defKey.replace(defKey.begin() + 6, defKey.end(), property);
    if (const char* value = mf->GetDefinition(defKey)) {
      this->SetProperty(property, value);
    }
  };
  auto initPropValue = [this, mf, &defKey](const std::string& property,
                                           const char* default_value) {
    // Replace everything after "CMAKE_"
    defKey.replace(defKey.begin() + 6, defKey.end(), property);
    if (const char* value = mf->GetDefinition(defKey)) {
      this->SetProperty(property, value);
    } else if (default_value) {
      this->SetProperty(property, default_value);
    }
  };

  // Setup default property values.
  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    initProp("ANDROID_API");
    initProp("ANDROID_API_MIN");
    initProp("ANDROID_ARCH");
    initProp("ANDROID_STL_TYPE");
    initProp("ANDROID_SKIP_ANT_STEP");
    initProp("ANDROID_PROCESS_MAX");
    initProp("ANDROID_PROGUARD");
    initProp("ANDROID_PROGUARD_CONFIG_PATH");
    initProp("ANDROID_SECURE_PROPS_PATH");
    initProp("ANDROID_NATIVE_LIB_DIRECTORIES");
    initProp("ANDROID_NATIVE_LIB_DEPENDENCIES");
    initProp("ANDROID_JAVA_SOURCE_DIR");
    initProp("ANDROID_JAR_DIRECTORIES");
    initProp("ANDROID_JAR_DEPENDENCIES");
    initProp("ANDROID_ASSETS_DIRECTORIES");
    initProp("ANDROID_ANT_ADDITIONAL_OPTIONS");
    initProp("BUILD_RPATH");
    initProp("BUILD_RPATH_USE_ORIGIN");
    initProp("INSTALL_NAME_DIR");
    initPropValue("INSTALL_RPATH", "");
    initPropValue("INSTALL_RPATH_USE_LINK_PATH", "OFF");
    initProp("INTERPROCEDURAL_OPTIMIZATION");
    initPropValue("SKIP_BUILD_RPATH", "OFF");
    initPropValue("BUILD_WITH_INSTALL_RPATH", "OFF");
    initProp("ARCHIVE_OUTPUT_DIRECTORY");
    initProp("LIBRARY_OUTPUT_DIRECTORY");
    initProp("RUNTIME_OUTPUT_DIRECTORY");
    initProp("PDB_OUTPUT_DIRECTORY");
    initProp("COMPILE_PDB_OUTPUT_DIRECTORY");
    initProp("FRAMEWORK");
    initProp("Fortran_FORMAT");
    initProp("Fortran_MODULE_DIRECTORY");
    initProp("Fortran_COMPILER_LAUNCHER");
    initProp("GNUtoMS");
    initProp("OSX_ARCHITECTURES");
    initProp("IOS_INSTALL_COMBINED");
    initProp("AUTOMOC");
    initProp("AUTOUIC");
    initProp("AUTORCC");
    initProp("AUTOGEN_ORIGIN_DEPENDS");
    initProp("AUTOGEN_PARALLEL");
    initProp("AUTOMOC_COMPILER_PREDEFINES");
    initProp("AUTOMOC_DEPEND_FILTERS");
    initProp("AUTOMOC_MACRO_NAMES");
    initProp("AUTOMOC_MOC_OPTIONS");
    initProp("AUTOUIC_OPTIONS");
    initProp("AUTOUIC_SEARCH_PATHS");
    initProp("AUTORCC_OPTIONS");
    initProp("LINK_DEPENDS_NO_SHARED");
    initProp("LINK_INTERFACE_LIBRARIES");
    initProp("MSVC_RUNTIME_LIBRARY");
    initProp("WIN32_EXECUTABLE");
    initProp("MACOSX_BUNDLE");
    initProp("MACOSX_RPATH");
    initProp("NO_SYSTEM_FROM_IMPORTED");
    initProp("BUILD_WITH_INSTALL_NAME_DIR");
    initProp("C_CLANG_TIDY");
    initProp("C_COMPILER_LAUNCHER");
    initProp("C_CPPLINT");
    initProp("C_CPPCHECK");
    initProp("C_INCLUDE_WHAT_YOU_USE");
    initProp("LINK_WHAT_YOU_USE");
    initProp("C_STANDARD");
    initProp("C_STANDARD_REQUIRED");
    initProp("C_EXTENSIONS");
    initProp("CXX_CLANG_TIDY");
    initProp("CXX_COMPILER_LAUNCHER");
    initProp("CXX_CPPLINT");
    initProp("CXX_CPPCHECK");
    initProp("CXX_INCLUDE_WHAT_YOU_USE");
    initProp("CXX_STANDARD");
    initProp("CXX_STANDARD_REQUIRED");
    initProp("CXX_EXTENSIONS");
    initProp("CUDA_STANDARD");
    initProp("CUDA_STANDARD_REQUIRED");
    initProp("CUDA_EXTENSIONS");
    initProp("CUDA_COMPILER_LAUNCHER");
    initProp("CUDA_SEPARABLE_COMPILATION");
    initProp("LINK_SEARCH_START_STATIC");
    initProp("LINK_SEARCH_END_STATIC");
    initProp("FOLDER");
    initProp("Swift_MODULE_DIRECTORY");
    initProp("VS_JUST_MY_CODE_DEBUGGING");
#ifdef __APPLE__
    if (this->GetGlobalGenerator()->IsXcode()) {
      initProp("XCODE_GENERATE_SCHEME");
      initProp("XCODE_SCHEME_ADDRESS_SANITIZER");
      initProp("XCODE_SCHEME_ADDRESS_SANITIZER_USE_AFTER_RETURN");
      initProp("XCODE_SCHEME_THREAD_SANITIZER");
      initProp("XCODE_SCHEME_THREAD_SANITIZER_STOP");
      initProp("XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER");
      initProp("XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER_STOP");
      initProp("XCODE_SCHEME_DISABLE_MAIN_THREAD_CHECKER");
      initProp("XCODE_SCHEME_MAIN_THREAD_CHECKER_STOP");
      initProp("XCODE_SCHEME_MALLOC_SCRIBBLE");
      initProp("XCODE_SCHEME_MALLOC_GUARD_EDGES");
      initProp("XCODE_SCHEME_GUARD_MALLOC");
      initProp("XCODE_SCHEME_ZOMBIE_OBJECTS");
      initProp("XCODE_SCHEME_MALLOC_STACK");
      initProp("XCODE_SCHEME_DYNAMIC_LINKER_API_USAGE");
      initProp("XCODE_SCHEME_DYNAMIC_LIBRARY_LOADS");
    }
#endif
  }

  // Setup per-configuration property default values.
  if (this->GetType() != cmStateEnums::UTILITY) {
    static const auto configProps = {
      /* clang-format needs this comment to break after the opening brace */
      "ARCHIVE_OUTPUT_DIRECTORY_",     "LIBRARY_OUTPUT_DIRECTORY_",
      "RUNTIME_OUTPUT_DIRECTORY_",     "PDB_OUTPUT_DIRECTORY_",
      "COMPILE_PDB_OUTPUT_DIRECTORY_", "MAP_IMPORTED_CONFIG_",
      "INTERPROCEDURAL_OPTIMIZATION_"
    };
    // Collect the set of configuration types.
    std::vector<std::string> configNames;
    mf->GetConfigurations(configNames);
    for (std::string const& configName : configNames) {
      std::string configUpper = cmSystemTools::UpperCase(configName);
      for (auto const& prop : configProps) {
        // Interface libraries have no output locations, so honor only
        // the configuration map.
        if (impl->TargetType == cmStateEnums::INTERFACE_LIBRARY &&
            strcmp(prop, "MAP_IMPORTED_CONFIG_") != 0) {
          continue;
        }
        std::string property = prop;
        property += configUpper;
        initProp(property);
      }

      // Initialize per-configuration name postfix property from the
      // variable only for non-executable targets.  This preserves
      // compatibility with previous CMake versions in which executables
      // did not support this variable.  Projects may still specify the
      // property directly.
      if (impl->TargetType != cmStateEnums::EXECUTABLE &&
          impl->TargetType != cmStateEnums::INTERFACE_LIBRARY) {
        std::string property = cmSystemTools::UpperCase(configName);
        property += "_POSTFIX";
        initProp(property);
      }
    }
  }

  // Save the backtrace of target construction.
  impl->Backtrace = impl->Makefile->GetBacktrace();

  if (!this->IsImported()) {
    // Initialize the INCLUDE_DIRECTORIES property based on the current value
    // of the same directory property:
    cmAppend(impl->IncludeDirectoriesEntries,
             impl->Makefile->GetIncludeDirectoriesEntries());
    cmAppend(impl->IncludeDirectoriesBacktraces,
             impl->Makefile->GetIncludeDirectoriesBacktraces());

    {
      auto const& sysInc = impl->Makefile->GetSystemIncludeDirectories();
      impl->SystemIncludeDirectories.insert(sysInc.begin(), sysInc.end());
    }

    cmAppend(impl->CompileOptionsEntries,
             impl->Makefile->GetCompileOptionsEntries());
    cmAppend(impl->CompileOptionsBacktraces,
             impl->Makefile->GetCompileOptionsBacktraces());

    cmAppend(impl->LinkOptionsEntries,
             impl->Makefile->GetLinkOptionsEntries());
    cmAppend(impl->LinkOptionsBacktraces,
             impl->Makefile->GetLinkOptionsBacktraces());

    cmAppend(impl->LinkDirectoriesEntries,
             impl->Makefile->GetLinkDirectoriesEntries());
    cmAppend(impl->LinkDirectoriesBacktraces,
             impl->Makefile->GetLinkDirectoriesBacktraces());
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    initProp("C_VISIBILITY_PRESET");
    initProp("CXX_VISIBILITY_PRESET");
    initProp("CUDA_VISIBILITY_PRESET");
    initProp("VISIBILITY_INLINES_HIDDEN");
  }

  if (impl->TargetType == cmStateEnums::EXECUTABLE) {
    initProp("ANDROID_GUI");
    initProp("CROSSCOMPILING_EMULATOR");
    initProp("ENABLE_EXPORTS");
  }
  if (impl->TargetType == cmStateEnums::SHARED_LIBRARY ||
      impl->TargetType == cmStateEnums::MODULE_LIBRARY) {
    this->SetProperty("POSITION_INDEPENDENT_CODE", "True");
  }
  if (impl->TargetType == cmStateEnums::SHARED_LIBRARY ||
      impl->TargetType == cmStateEnums::EXECUTABLE) {
    initProp("WINDOWS_EXPORT_ALL_SYMBOLS");
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    initProp("POSITION_INDEPENDENT_CODE");
  }

  // Record current policies for later use.
  impl->Makefile->RecordPolicies(impl->PolicyMap);

  if (impl->TargetType == cmStateEnums::INTERFACE_LIBRARY) {
    // This policy is checked in a few conditions. The properties relevant
    // to the policy are always ignored for cmStateEnums::INTERFACE_LIBRARY
    // targets,
    // so ensure that the conditions don't lead to nonsense.
    impl->PolicyMap.Set(cmPolicies::CMP0022, cmPolicies::NEW);
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    initProp("JOB_POOL_COMPILE");
    initProp("JOB_POOL_LINK");
  }

  if (impl->TargetType <= cmStateEnums::UTILITY) {
    initProp("DOTNET_TARGET_FRAMEWORK_VERSION");
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {

    // check for "CMAKE_VS_GLOBALS" variable and set up target properties
    // if any
    const char* globals = mf->GetDefinition("CMAKE_VS_GLOBALS");
    if (globals) {
      const std::string genName = mf->GetGlobalGenerator()->GetName();
      if (cmHasLiteralPrefix(genName, "Visual Studio")) {
        std::vector<std::string> props;
        cmSystemTools::ExpandListArgument(globals, props);
        const std::string vsGlobal = "VS_GLOBAL_";
        for (const std::string& i : props) {
          // split NAME=VALUE
          const std::string::size_type assignment = i.find('=');
          if (assignment != std::string::npos) {
            const std::string propName = vsGlobal + i.substr(0, assignment);
            const std::string propValue = i.substr(assignment + 1);
            initPropValue(propName, propValue.c_str());
          }
        }
      }
    }
  }
}